

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Token __thiscall slang::parsing::Parser::parseSigning(Parser *this)

{
  ParserBase *in_RDI;
  Token TVar1;
  undefined6 in_stack_ffffffffffffffd0;
  TokenKind local_28;
  Token in_stack_fffffffffffffff0;
  
  TVar1 = ParserBase::peek(in_RDI);
  local_28 = TVar1.kind;
  if ((local_28 == SignedKeyword) || (local_28 == UnsignedKeyword)) {
    in_stack_fffffffffffffff0 = ParserBase::consume(in_stack_fffffffffffffff0._0_8_);
  }
  else {
    Token::Token((Token *)CONCAT26(local_28,in_stack_ffffffffffffffd0));
  }
  return in_stack_fffffffffffffff0;
}

Assistant:

Token Parser::parseSigning() {
    switch (peek().kind) {
        case TokenKind::SignedKeyword:
        case TokenKind::UnsignedKeyword:
            return consume();
        default:
            return Token();
    }
}